

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FtpServer.cpp
# Opt level: O0

void __thiscall gnl::FtpServer::removeFd(FtpServer *this,int closeFd)

{
  FtpConsole *this_00;
  ssize_t sVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Rb_tree_iterator<std::pair<const_int,_gnl::FtpConsole_&>_> local_38;
  int local_30;
  int local_2c;
  int revFd;
  int num;
  char fd [16];
  int closeFd_local;
  FtpServer *this_local;
  
  fd._12_4_ = closeFd;
  memset(&revFd,0,0x10);
  local_2c = 0xffffffff;
  sVar1 = read(fd._12_4_,&revFd,0x11);
  local_2c = (int)sVar1;
  if (local_2c == -1) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"read colseFd error!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  }
  else {
    if (local_2c == 0) {
      poVar2 = std::operator<<((ostream *)&std::cerr,"closeFd[1] has been closed !");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      exit(-1);
    }
    local_30 = atoi((char *)&revFd);
    if (2 < local_30) {
      local_38._M_node =
           (_Base_ptr)
           std::
           map<int,_gnl::FtpConsole_&,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
           ::find(&this->mConnection,&local_30);
      ppVar3 = std::_Rb_tree_iterator<std::pair<const_int,_gnl::FtpConsole_&>_>::operator->
                         (&local_38);
      this_00 = ppVar3->second;
      if (this_00 != (FtpConsole *)0x0) {
        FtpConsole::~FtpConsole(this_00);
        operator_delete(this_00);
      }
      std::
      map<int,_gnl::FtpConsole_&,_std::less<int>,_std::allocator<std::pair<const_int,_gnl::FtpConsole_&>_>_>
      ::erase(&this->mConnection,&local_30);
      close(local_30);
    }
  }
  return;
}

Assistant:

void FtpServer::removeFd(int closeFd){
        char fd[16] = {'\0'};
        int num = -1;
        if((num = read(closeFd, fd, sizeof(fd)+1)) == -1){
            std::cerr << "read colseFd error!" << std::endl;
            return;
        }else if(num == 0){
            std::cerr << "closeFd[1] has been closed !" << std::endl;
            exit(-1);
        }else{
            int revFd = atoi(fd);
            if(revFd > 2){
                delete (FtpConsole*)&mConnection.find(revFd)->second;
                //delete console;
                mConnection.erase(revFd);   //remove client socket from the mConnection
                close(revFd);   //close client socket
            }
        }
    }